

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_real_equal_real_literal(void)

{
  undefined1 local_9d9;
  longdouble local_9d8;
  basic_variable<std::allocator<char>_> local_9c8;
  undefined1 local_98b [2];
  undefined1 local_989;
  longdouble local_988;
  basic_variable<std::allocator<char>_> local_978;
  undefined1 local_93b [2];
  undefined1 local_939;
  longdouble local_938;
  basic_variable<std::allocator<char>_> local_928;
  undefined1 local_8eb [2];
  undefined1 local_8e9;
  longdouble local_8e8;
  basic_variable<std::allocator<char>_> local_8d8;
  undefined1 local_8a3 [2];
  undefined1 local_8a1;
  double local_8a0;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_863 [2];
  undefined1 local_861;
  double local_860;
  basic_variable<std::allocator<char>_> local_858;
  undefined1 local_823 [2];
  undefined1 local_821;
  double local_820;
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7e3 [2];
  undefined1 local_7e1;
  double local_7e0;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_79f [2];
  undefined1 local_79d;
  float local_79c;
  basic_variable<std::allocator<char>_> local_798;
  undefined1 local_75f [2];
  undefined1 local_75d;
  float local_75c;
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_71f [2];
  undefined1 local_71d;
  float local_71c;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6df [2];
  undefined1 local_6dd;
  float local_6dc;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  longdouble local_698;
  basic_variable<std::allocator<char>_> local_688;
  undefined1 local_64b [2];
  undefined1 local_649;
  longdouble local_648;
  basic_variable<std::allocator<char>_> local_638;
  undefined1 local_5fb [2];
  undefined1 local_5f9;
  longdouble local_5f8;
  basic_variable<std::allocator<char>_> local_5e8;
  undefined1 local_5ab [2];
  undefined1 local_5a9;
  longdouble local_5a8;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_563 [2];
  undefined1 local_561;
  double local_560;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_523 [2];
  undefined1 local_521;
  double local_520;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4e3 [2];
  undefined1 local_4e1;
  double local_4e0;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_4a3 [2];
  undefined1 local_4a1;
  double local_4a0;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45f [2];
  undefined1 local_45d;
  float local_45c;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41f [2];
  undefined1 local_41d;
  float local_41c;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3df [2];
  undefined1 local_3dd;
  float local_3dc;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39f [2];
  undefined1 local_39d;
  float local_39c;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  longdouble local_358;
  basic_variable<std::allocator<char>_> local_348;
  undefined1 local_30b [2];
  undefined1 local_309;
  longdouble local_308;
  basic_variable<std::allocator<char>_> local_2f8;
  undefined1 local_2bb [2];
  undefined1 local_2b9;
  longdouble local_2b8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 local_26b [2];
  undefined1 local_269;
  longdouble local_268;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_223 [2];
  undefined1 local_221;
  double local_220;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1e3 [2];
  undefined1 local_1e1;
  double local_1e0;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_1a3 [2];
  undefined1 local_1a1;
  double local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_163 [2];
  undefined1 local_161;
  double local_160;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11f [2];
  undefined1 local_11d;
  float local_11c;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_df [2];
  undefined1 local_dd;
  float local_dc;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9f [2];
  undefined1 local_9d;
  float local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  float local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_48,0.0);
  local_4c = 0.0;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 0.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5ad,"void equality_suite::compare_real_equal_real_literal()",local_a,&local_4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_98,0.0);
  local_9c = 0.0;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 0.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5ae,"void equality_suite::compare_real_equal_real_literal()",local_5e,&local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_d8,0.0);
  local_dc = 1.0;
  local_9f[0] = trial::dynamic::operator==(&local_d8,&local_dc);
  local_dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 1.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5af,"void equality_suite::compare_real_equal_real_literal()",local_9f,&local_dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_118,0.0);
  local_11c = 1.0;
  local_df[0] = trial::dynamic::operator!=(&local_118,&local_11c);
  local_11d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 1.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5b0,"void equality_suite::compare_real_equal_real_literal()",local_df,&local_11d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_158,0.0);
  local_160 = 0.0;
  local_11f[0] = trial::dynamic::operator==(&local_158,&local_160);
  local_161 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 0.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5b4,"void equality_suite::compare_real_equal_real_literal()",local_11f,&local_161);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_198,0.0);
  local_1a0 = 0.0;
  local_163[0] = trial::dynamic::operator!=(&local_198,&local_1a0);
  local_1a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 0.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5b5,"void equality_suite::compare_real_equal_real_literal()",local_163,&local_1a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_1d8,0.0);
  local_1e0 = 1.0;
  local_1a3[0] = trial::dynamic::operator==(&local_1d8,&local_1e0);
  local_1e1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 1.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5b6,"void equality_suite::compare_real_equal_real_literal()",local_1a3,&local_1e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_218,0.0);
  local_220 = 1.0;
  local_1e3[0] = trial::dynamic::operator!=(&local_218,&local_220);
  local_221 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 1.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5b7,"void equality_suite::compare_real_equal_real_literal()",local_1e3,&local_221);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_258,0.0);
  local_268 = (longdouble)0;
  local_223[0] = trial::dynamic::operator==(&local_258,&local_268);
  local_269 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 0.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5bb,"void equality_suite::compare_real_equal_real_literal()",local_223,&local_269);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2a8,0.0);
  local_2b8 = (longdouble)0;
  local_26b[0] = trial::dynamic::operator!=(&local_2a8,&local_2b8);
  local_2b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 0.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5bc,"void equality_suite::compare_real_equal_real_literal()",local_26b,&local_2b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2f8,0.0);
  local_308 = (longdouble)1;
  local_2bb[0] = trial::dynamic::operator==(&local_2f8,&local_308);
  local_309 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 1.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5bd,"void equality_suite::compare_real_equal_real_literal()",local_2bb,&local_309);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_348,0.0);
  local_358 = (longdouble)1;
  local_30b[0] = trial::dynamic::operator!=(&local_348,&local_358);
  local_359 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 1.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5be,"void equality_suite::compare_real_equal_real_literal()",local_30b,&local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_398,0.0);
  local_39c = 0.0;
  local_35b[0] = trial::dynamic::operator==(&local_398,&local_39c);
  local_39d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 0.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5c2,"void equality_suite::compare_real_equal_real_literal()",local_35b,&local_39d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3d8,0.0);
  local_3dc = 0.0;
  local_39f[0] = trial::dynamic::operator!=(&local_3d8,&local_3dc);
  local_3dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 0.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5c3,"void equality_suite::compare_real_equal_real_literal()",local_39f,&local_3dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_418,0.0);
  local_41c = 1.0;
  local_3df[0] = trial::dynamic::operator==(&local_418,&local_41c);
  local_41d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 1.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5c4,"void equality_suite::compare_real_equal_real_literal()",local_3df,&local_41d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_458,0.0);
  local_45c = 1.0;
  local_41f[0] = trial::dynamic::operator!=(&local_458,&local_45c);
  local_45d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 1.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5c5,"void equality_suite::compare_real_equal_real_literal()",local_41f,&local_45d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_498,0.0);
  local_4a0 = 0.0;
  local_45f[0] = trial::dynamic::operator==(&local_498,&local_4a0);
  local_4a1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 0.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5c9,"void equality_suite::compare_real_equal_real_literal()",local_45f,&local_4a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_4d8,0.0);
  local_4e0 = 0.0;
  local_4a3[0] = trial::dynamic::operator!=(&local_4d8,&local_4e0);
  local_4e1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 0.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5ca,"void equality_suite::compare_real_equal_real_literal()",local_4a3,&local_4e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_518,0.0);
  local_520 = 1.0;
  local_4e3[0] = trial::dynamic::operator==(&local_518,&local_520);
  local_521 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 1.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5cb,"void equality_suite::compare_real_equal_real_literal()",local_4e3,&local_521);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_558,0.0);
  local_560 = 1.0;
  local_523[0] = trial::dynamic::operator!=(&local_558,&local_560);
  local_561 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 1.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5cc,"void equality_suite::compare_real_equal_real_literal()",local_523,&local_561);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_598,0.0);
  local_5a8 = (longdouble)0;
  local_563[0] = trial::dynamic::operator==(&local_598,&local_5a8);
  local_5a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 0.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d0,"void equality_suite::compare_real_equal_real_literal()",local_563,&local_5a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5e8,0.0);
  local_5f8 = (longdouble)0;
  local_5ab[0] = trial::dynamic::operator!=(&local_5e8,&local_5f8);
  local_5f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 0.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d1,"void equality_suite::compare_real_equal_real_literal()",local_5ab,&local_5f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_638,0.0);
  local_648 = (longdouble)1;
  local_5fb[0] = trial::dynamic::operator==(&local_638,&local_648);
  local_649 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 1.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d2,"void equality_suite::compare_real_equal_real_literal()",local_5fb,&local_649);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_688,0.0);
  local_698 = (longdouble)1;
  local_64b[0] = trial::dynamic::operator!=(&local_688,&local_698);
  local_699 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 1.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d3,"void equality_suite::compare_real_equal_real_literal()",local_64b,&local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_6d8,(longdouble)0);
  local_6dc = 0.0;
  local_69b[0] = trial::dynamic::operator==(&local_6d8,&local_6dc);
  local_6dd = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 0.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d7,"void equality_suite::compare_real_equal_real_literal()",local_69b,&local_6dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_718,(longdouble)0);
  local_71c = 0.0;
  local_6df[0] = trial::dynamic::operator!=(&local_718,&local_71c);
  local_71d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 0.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d8,"void equality_suite::compare_real_equal_real_literal()",local_6df,&local_71d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_758,(longdouble)0);
  local_75c = 1.0;
  local_71f[0] = trial::dynamic::operator==(&local_758,&local_75c);
  local_75d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 1.0f","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5d9,"void equality_suite::compare_real_equal_real_literal()",local_71f,&local_75d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_798,(longdouble)0);
  local_79c = 1.0;
  local_75f[0] = trial::dynamic::operator!=(&local_798,&local_79c);
  local_79d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 1.0f","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5da,"void equality_suite::compare_real_equal_real_literal()",local_75f,&local_79d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_7d8,(longdouble)0);
  local_7e0 = 0.0;
  local_79f[0] = trial::dynamic::operator==(&local_7d8,&local_7e0);
  local_7e1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 0.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5de,"void equality_suite::compare_real_equal_real_literal()",local_79f,&local_7e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_818,(longdouble)0);
  local_820 = 0.0;
  local_7e3[0] = trial::dynamic::operator!=(&local_818,&local_820);
  local_821 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 0.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5df,"void equality_suite::compare_real_equal_real_literal()",local_7e3,&local_821);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_858,(longdouble)0);
  local_860 = 1.0;
  local_823[0] = trial::dynamic::operator==(&local_858,&local_860);
  local_861 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 1.0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e0,"void equality_suite::compare_real_equal_real_literal()",local_823,&local_861);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_898,(longdouble)0);
  local_8a0 = 1.0;
  local_863[0] = trial::dynamic::operator!=(&local_898,&local_8a0);
  local_8a1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 1.0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e1,"void equality_suite::compare_real_equal_real_literal()",local_863,&local_8a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_8d8,(longdouble)0);
  local_8e8 = (longdouble)0;
  local_8a3[0] = trial::dynamic::operator==(&local_8d8,&local_8e8);
  local_8e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 0.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e5,"void equality_suite::compare_real_equal_real_literal()",local_8a3,&local_8e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_928,(longdouble)0);
  local_938 = (longdouble)0;
  local_8eb[0] = trial::dynamic::operator!=(&local_928,&local_938);
  local_939 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 0.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e6,"void equality_suite::compare_real_equal_real_literal()",local_8eb,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_978,(longdouble)0);
  local_988 = (longdouble)1;
  local_93b[0] = trial::dynamic::operator==(&local_978,&local_988);
  local_989 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 1.0L","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e7,"void equality_suite::compare_real_equal_real_literal()",local_93b,&local_989);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_9c8,(longdouble)0);
  local_9d8 = (longdouble)1;
  local_98b[0] = trial::dynamic::operator!=(&local_9c8,&local_9d8);
  local_9d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 1.0L","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5e8,"void equality_suite::compare_real_equal_real_literal()",local_98b,&local_9d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9c8);
  return;
}

Assistant:

void compare_real_equal_real_literal()
{
    // float - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 0.0f, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 0.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 1.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 1.0f, true);
    }
    // float - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 0.0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 0.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 1.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 1.0, true);
    }
    // float - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 0.0L, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 0.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 1.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 1.0L, true);
    }
    // double - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 0.0f, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 0.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 1.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 1.0f, true);
    }
    // double - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 0.0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 0.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 1.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 1.0, true);
    }
    // double - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 0.0L, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 0.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 1.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 1.0L, true);
    }
    // long double - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 0.0f, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 0.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 1.0f, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 1.0f, true);
    }
    // long double - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 0.0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 0.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 1.0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 1.0, true);
    }
    // long double - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 0.0L, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 0.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 1.0L, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 1.0L, true);
    }
}